

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O2

bool tchecker::ta::has_diagonal_constraint(system_t *system)

{
  bool bVar1;
  has_clock_constraints_t hVar2;
  const_iterator __r;
  typed_expression_t *ptVar3;
  const_iterator __r_00;
  bool bVar4;
  range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
  rVar5;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  rVar6;
  long local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  rVar5 = tchecker::system::locs_t::locations(&(system->super_system_t).super_system_t.super_locs_t)
  ;
  __r._M_current =
       (shared_ptr<tchecker::system::loc_t> *)rVar5._begin.super_const_iterator._M_current;
  do {
    if ((const_iterator)__r._M_current ==
        rVar5._end.super_const_iterator._M_current.super_const_iterator) {
      rVar6 = tchecker::system::edges_t::edges
                        (&(system->super_system_t).super_system_t.super_edges_t);
      __r_00._M_current =
           (shared_ptr<tchecker::system::edge_t> *)rVar6._begin.super_const_iterator._M_current;
      do {
        bVar4 = (const_iterator)__r_00._M_current ==
                rVar6._end.super_const_iterator._M_current.super_const_iterator;
        bVar1 = !bVar4;
        if (bVar4) {
          return bVar1;
        }
        std::__shared_ptr<tchecker::system::edge_t_const,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<tchecker::system::edge_t,void>
                  ((__shared_ptr<tchecker::system::edge_t_const,(__gnu_cxx::_Lock_policy)2> *)
                   &local_40,
                   &(__r_00._M_current)->
                    super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>);
        ptVar3 = system_t::guard(system,*(edge_id_t *)(local_40 + 4));
        hVar2 = has_clock_constraints(ptVar3);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
        __r_00._M_current = __r_00._M_current + 1;
      } while (((ushort)hVar2 >> 8 & 1) == 0);
      return bVar1;
    }
    std::__shared_ptr<tchecker::system::loc_t_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<tchecker::system::loc_t,void>
              ((__shared_ptr<tchecker::system::loc_t_const,(__gnu_cxx::_Lock_policy)2> *)&local_40,
               &(__r._M_current)->
                super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>);
    ptVar3 = system_t::invariant(system,*(loc_id_t *)(local_40 + 4));
    hVar2 = has_clock_constraints(ptVar3);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    __r._M_current = __r._M_current + 1;
  } while (((ushort)hVar2 >> 8 & 1) == 0);
  return true;
}

Assistant:

bool has_diagonal_constraint(tchecker::ta::system_t const & system)
{
  // Check location invariants
  for (tchecker::system::loc_const_shared_ptr_t const & loc : system.locations()) {
    tchecker::has_clock_constraints_t invariant_has_clock_constraints =
        tchecker::has_clock_constraints(system.invariant(loc->id()));
    if (invariant_has_clock_constraints.diagonal)
      return true;
  }

  // Check edge guards
  for (tchecker::system::edge_const_shared_ptr_t const & edge : system.edges()) {
    tchecker::has_clock_constraints_t guard_has_clock_constrains = tchecker::has_clock_constraints(system.guard(edge->id()));
    if (guard_has_clock_constrains.diagonal)
      return true;
  }

  return false;
}